

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

string * __thiscall libtorrent::settings_pack::get_str_abi_cxx11_(settings_pack *this,int name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer ppVar5;
  value_type *pvVar6;
  bool bVar7;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a0;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  unsigned_short local_4a;
  undefined1 local_48 [8];
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  int name_local;
  settings_pack *this_local;
  
  v.second.field_2._12_4_ = name;
  if ((get_str[abi:cxx11](int)::empty_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&get_str[abi:cxx11](int)::empty_abi_cxx11_), iVar2 != 0)) {
    ::std::__cxx11::string::string((string *)&get_str[abi:cxx11](int)::empty_abi_cxx11_);
    __cxa_atexit(::std::__cxx11::string::~string,&get_str[abi:cxx11](int)::empty_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&get_str[abi:cxx11](int)::empty_abi_cxx11_);
  }
  if ((v.second.field_2._12_4_ & 0xc000) == 0) {
    sVar3 = ::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->m_strings);
    if (sVar3 == 0xd) {
      pvVar4 = ::std::
               vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_strings,(long)(int)(v.second.field_2._12_4_ & 0x3fff));
      this_local = (settings_pack *)&pvVar4->second;
    }
    else {
      local_4a = libtorrent::aux::numeric_cast<unsigned_short,int,void>(v.second.field_2._12_4_);
      ::std::__cxx11::string::string((string *)&local_70);
      ::std::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_48,&local_4a,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      local_90._M_current =
           (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)::std::
              vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin(&this->m_strings);
      local_98 = (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)::std::
                    vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(&this->m_strings);
      local_88 = ::std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>
                           (local_90,(__normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      )local_98,
                            (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_48,::(anonymous_namespace)::compare_first<std::__cxx11::string>
                           );
      local_a0._M_current =
           (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)::std::
              vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->m_strings);
      bVar1 = __gnu_cxx::operator!=(&local_88,&local_a0);
      bVar7 = false;
      if (bVar1) {
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&local_88);
        bVar7 = (uint)ppVar5->first == v.second.field_2._12_4_;
      }
      if (bVar7) {
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->(&local_88);
        this_local = (settings_pack *)&ppVar5->second;
      }
      else {
        pvVar6 = libtorrent::aux::
                 container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                 ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                               *)(anonymous_namespace)::str_settings,
                              (ulong)(v.second.field_2._12_4_ & 0x3fff));
        this_local = (settings_pack *)&pvVar6->default_value;
      }
      ::std::
      pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
    }
  }
  else {
    this_local = (settings_pack *)&get_str[abi:cxx11](int)::empty_abi_cxx11_;
  }
  return (string *)this_local;
}

Assistant:

std::string const& settings_pack::get_str(int name) const
	{
		static std::string const empty;
		TORRENT_ASSERT_PRECOND((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return empty;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_strings.size() == settings_pack::num_string_settings)
		{
			TORRENT_ASSERT(m_strings[name & index_mask].first == name);
			return m_strings[name & index_mask].second;
		}
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
		auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
				, &compare_first<std::string>);
		if (i != m_strings.end() && i->first == name) return i->second;

		return str_settings[name & index_mask].default_value;
	}